

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

void chacha20_block(uint32_t *initial_state,uchar *keystream)

{
  long lVar1;
  size_t offset;
  size_t i;
  uint32_t working_state [16];
  uchar *keystream_local;
  uint32_t *initial_state_local;
  
  working_state._56_8_ = keystream;
  memcpy(&i,initial_state,0x40);
  for (offset = 0; offset < 10; offset = offset + 1) {
    chacha20_inner_block((uint32_t *)&i);
  }
  i._0_4_ = *initial_state + (int)i;
  i._4_4_ = initial_state[1] + i._4_4_;
  working_state[0] = initial_state[2] + working_state[0];
  working_state[1] = initial_state[3] + working_state[1];
  working_state[2] = initial_state[4] + working_state[2];
  working_state[3] = initial_state[5] + working_state[3];
  working_state[4] = initial_state[6] + working_state[4];
  working_state[5] = initial_state[7] + working_state[5];
  working_state[6] = initial_state[8] + working_state[6];
  working_state[7] = initial_state[9] + working_state[7];
  working_state[8] = initial_state[10] + working_state[8];
  working_state[9] = initial_state[0xb] + working_state[9];
  working_state[10] = initial_state[0xc] + working_state[10];
  working_state[0xb] = initial_state[0xd] + working_state[0xb];
  working_state[0xc] = initial_state[0xe] + working_state[0xc];
  working_state[0xd] = initial_state[0xf] + working_state[0xd];
  for (offset = 0; offset < 0x10; offset = offset + 1) {
    lVar1 = offset * 4;
    *(char *)(working_state._56_8_ + lVar1) = (char)working_state[offset - 2];
    *(char *)(working_state._56_8_ + 1 + lVar1) = (char)(working_state[offset - 2] >> 8);
    *(char *)(working_state._56_8_ + 2 + lVar1) = (char)(working_state[offset - 2] >> 0x10);
    *(char *)(working_state._56_8_ + 3 + lVar1) = (char)(working_state[offset - 2] >> 0x18);
  }
  mbedtls_platform_zeroize(&i,0x40);
  return;
}

Assistant:

static void chacha20_block( const uint32_t initial_state[16],
                            unsigned char keystream[64] )
{
    uint32_t working_state[16];
    size_t i;

    memcpy( working_state,
            initial_state,
            CHACHA20_BLOCK_SIZE_BYTES );

    for( i = 0U; i < 10U; i++ )
        chacha20_inner_block( working_state );

    working_state[ 0] += initial_state[ 0];
    working_state[ 1] += initial_state[ 1];
    working_state[ 2] += initial_state[ 2];
    working_state[ 3] += initial_state[ 3];
    working_state[ 4] += initial_state[ 4];
    working_state[ 5] += initial_state[ 5];
    working_state[ 6] += initial_state[ 6];
    working_state[ 7] += initial_state[ 7];
    working_state[ 8] += initial_state[ 8];
    working_state[ 9] += initial_state[ 9];
    working_state[10] += initial_state[10];
    working_state[11] += initial_state[11];
    working_state[12] += initial_state[12];
    working_state[13] += initial_state[13];
    working_state[14] += initial_state[14];
    working_state[15] += initial_state[15];

    for( i = 0U; i < 16; i++ )
    {
        size_t offset = i * 4U;

        keystream[offset     ] = (unsigned char)( working_state[i]       );
        keystream[offset + 1U] = (unsigned char)( working_state[i] >>  8 );
        keystream[offset + 2U] = (unsigned char)( working_state[i] >> 16 );
        keystream[offset + 3U] = (unsigned char)( working_state[i] >> 24 );
    }

    mbedtls_platform_zeroize( working_state, sizeof( working_state ) );
}